

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackable_ptr.h
# Opt level: O0

int __thiscall
tower120::detail::trackable_ptr_base::init(trackable_ptr_base *this,EVP_PKEY_CTX *ctx)

{
  trackable_ptr_base *ptVar1;
  trackable_ptr_base **first_ptr;
  trackable_base *obj_local;
  trackable_ptr_base *this_local;
  
  this->obj = (trackable_base *)ctx;
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    ptVar1 = (trackable_ptr_base *)this->obj;
    this->prev = (trackable_ptr_base *)0x0;
    this->next = (trackable_ptr_base *)ptVar1->obj;
    if (ptVar1->obj != (trackable_base *)0x0) {
      ptVar1->obj[2].first_ptr = this;
    }
    ptVar1->obj = (trackable_base *)this;
    this = ptVar1;
  }
  return (int)this;
}

Assistant:

void init(trackable_base* obj) noexcept {
                this->obj = obj;
                if (!obj) return;

                auto& first_ptr = this->obj->first_ptr;

                this->prev = nullptr;
                this->next = first_ptr;

                if (first_ptr) first_ptr->prev = this;
                first_ptr = this;
            }